

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall soplex::CLUFactor<double>::initFactorRings(CLUFactor<double> *this)

{
  int *piVar1;
  int *piVar2;
  Pring *pPVar3;
  int *piVar4;
  int *piVar5;
  pointer pdVar6;
  int *piVar7;
  Pring *pPVar8;
  Pring *pPVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  Pring *pPVar13;
  Pring *pPVar14;
  long lVar15;
  
  piVar1 = (this->row).perm;
  piVar2 = (this->col).perm;
  spx_alloc<soplex::CLUFactor<double>::Pring*>(&(this->temp).pivot_col,this->thedim + 1);
  spx_alloc<soplex::CLUFactor<double>::Pring*>(&(this->temp).pivot_colNZ,this->thedim + 1);
  spx_alloc<soplex::CLUFactor<double>::Pring*>(&(this->temp).pivot_row,this->thedim + 1);
  spx_alloc<soplex::CLUFactor<double>::Pring*>(&(this->temp).pivot_rowNZ,this->thedim + 1);
  iVar10 = this->thedim;
  pPVar3 = (this->temp).pivot_colNZ;
  pPVar13 = (this->temp).pivot_rowNZ;
  for (uVar11 = iVar10 - (this->temp).stage; -1 < (int)uVar11; uVar11 = uVar11 - 1) {
    pPVar3[uVar11].next = pPVar3 + uVar11;
    pPVar3[uVar11].prev = pPVar3 + uVar11;
    pPVar13[uVar11].next = pPVar13 + uVar11;
    pPVar13[uVar11].prev = pPVar13 + uVar11;
  }
  piVar4 = (this->u).row.len;
  piVar5 = (this->temp).s_mark;
  pPVar3 = (this->temp).pivot_rowNZ;
  pPVar13 = (this->temp).pivot_row;
  pdVar6 = (this->temp).s_max.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar7 = (this->temp).s_cact;
  pPVar8 = (this->temp).pivot_colNZ;
  pPVar14 = (this->temp).pivot_col;
  lVar15 = 0;
  do {
    if (iVar10 <= lVar15) {
      return;
    }
    if (piVar1[lVar15] < 0) {
      lVar12 = (long)piVar4[lVar15];
      if (lVar12 < 1) goto LAB_001a57cc;
      pPVar9 = pPVar3[lVar12].next;
      pPVar13->next = pPVar9;
      pPVar9->prev = pPVar13;
      pPVar13->prev = pPVar3 + lVar12;
      pPVar3[lVar12].next = pPVar13;
      pPVar13->idx = (int)lVar15;
      pdVar6[lVar15] = -1.0;
    }
    if (piVar2[lVar15] < 0) {
      lVar12 = (long)piVar7[lVar15];
      if (lVar12 < 1) {
LAB_001a57cc:
        this->stat = SINGULAR;
        return;
      }
      pPVar9 = pPVar8[lVar12].next;
      pPVar14->next = pPVar9;
      pPVar9->prev = pPVar14;
      pPVar14->prev = pPVar8 + lVar12;
      pPVar8[lVar12].next = pPVar14;
      pPVar14->idx = (int)lVar15;
      piVar5[lVar15] = 0;
      iVar10 = this->thedim;
    }
    lVar15 = lVar15 + 1;
    pPVar14 = pPVar14 + 1;
    pPVar13 = pPVar13 + 1;
  } while( true );
}

Assistant:

void CLUFactor<R>::initFactorRings()
{
   int i;
   int* rperm = row.perm;
   int* cperm = col.perm;
   CLUFactor<R>::Pring* ring;

   assert(thedim >= 0);
   spx_alloc(temp.pivot_col,   thedim + 1);
   spx_alloc(temp.pivot_colNZ, thedim + 1);
   spx_alloc(temp.pivot_row,   thedim + 1);
   spx_alloc(temp.pivot_rowNZ, thedim + 1);

   for(i = thedim - temp.stage; i >= 0; --i)
   {
      initDR(temp.pivot_colNZ[i]);
      initDR(temp.pivot_rowNZ[i]);
   }

   for(i = 0; i < thedim; ++i)
   {
      if(rperm[i] < 0)
      {
         if(u.row.len[i] <= 0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            return;
         }

         ring = &(temp.pivot_rowNZ[u.row.len[i]]);

         init2DR(temp.pivot_row[i], *ring);
         temp.pivot_row[i].idx = i;
         temp.s_max[i] = -1;
      }

      if(cperm[i] < 0)
      {
         if(temp.s_cact[i] <= 0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            return;
         }

         ring = &(temp.pivot_colNZ[temp.s_cact[i]]);

         init2DR(temp.pivot_col[i], *ring);
         temp.pivot_col[i].idx = i;
         temp.s_mark[i] = 0;
      }
   }
}